

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O0

void __thiscall HDual::major_updateFtranFinal(HDual *this)

{
  double dVar1;
  pointer piVar2;
  pointer piVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  HVector *pivot_00;
  long lVar7;
  long in_RDI;
  double dVar8;
  double dVar9;
  double pivotX2_1;
  double pivotX1_1;
  int pivotRow_1;
  MFinish *jFinish;
  int jFn_1;
  HVector *Row;
  HVector *Col;
  MFinish *Fin;
  int iFn_1;
  int i_1;
  double pivot_1;
  int i;
  double pivot;
  double pivotX2;
  double pivotX1;
  double *pivotArray;
  double pivotAlpha;
  int pivotRow;
  int jFn;
  double *myRow;
  double *myCol;
  int iFn;
  int updateFTRAN_inDense;
  int in_stack_ffffffffffffff3c;
  HTimer *in_stack_ffffffffffffff40;
  int local_84;
  int iVar10;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar11;
  HVector *in_stack_ffffffffffffffa0;
  int local_54;
  int local_24;
  int local_10;
  
  HTimer::recordStart(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  if (*(int *)(in_RDI + 0x610) < 0) {
    for (local_10 = 0; local_10 < *(int *)(in_RDI + 0xefe8); local_10 = local_10 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + (long)local_10 * 0x78 + 0x13c60) + 4) = 0xffffffff;
      *(undefined4 *)(*(long *)(in_RDI + (long)local_10 * 0x78 + 0x13c58) + 4) = 0xffffffff;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + (long)local_10 * 0x78 + 0x13c60) + 0x20),0);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)(in_RDI + (long)local_10 * 0x78 + 0x13c58) + 0x20),0);
      for (local_24 = 0; local_24 < local_10; local_24 = local_24 + 1) {
        iVar10 = *(int *)(in_RDI + (long)local_24 * 0x78 + 0x13c20);
        dVar1 = *(double *)(in_RDI + (long)local_24 * 0x78 + 0x13c30);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            (*(long *)(in_RDI + (long)local_24 * 0x78 + 0x13c60) + 0x20),0);
        dVar9 = pvVar5[iVar10];
        if (1e-14 < ABS(pvVar4[iVar10])) {
          dVar8 = pvVar4[iVar10] / dVar1;
          for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x7c); local_54 = local_54 + 1) {
            pvVar4[local_54] = -dVar8 * pvVar6[local_54] + pvVar4[local_54];
          }
          pvVar4[iVar10] = dVar8;
        }
        if (1e-14 < ABS(dVar9)) {
          dVar9 = dVar9 / dVar1;
          for (iVar11 = 0; iVar11 < *(int *)(in_RDI + 0x7c); iVar11 = iVar11 + 1) {
            pvVar5[iVar11] = -dVar9 * pvVar6[iVar11] + pvVar5[iVar11];
          }
          pvVar5[iVar10] = dVar9;
        }
      }
    }
  }
  else {
    for (iVar10 = 0; iVar10 < *(int *)(in_RDI + 0xefe8); iVar10 = iVar10 + 1) {
      pivot_00 = (HVector *)(in_RDI + 0x13bf8 + (long)iVar10 * 0x78);
      piVar2 = (pivot_00->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar3 = (pivot_00->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (local_84 = 0; local_84 < iVar10; local_84 = local_84 + 1) {
        lVar7 = in_RDI + 0x13bf8 + (long)local_84 * 0x78;
        iVar11 = *(int *)(lVar7 + 0x28);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(piVar2 + 8),(long)iVar11);
        dVar1 = *pvVar4;
        if (1e-14 < ABS(dVar1)) {
          dVar9 = *(double *)(lVar7 + 0x38);
          HVector::saxpy(in_stack_ffffffffffffffa0,
                         (double)CONCAT44(in_stack_ffffffffffffff9c,iVar10),pivot_00);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(piVar2 + 8),(long)iVar11);
          *pvVar4 = dVar1 / dVar9;
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(piVar3 + 8),(long)iVar11);
        if (1e-14 < ABS(*pvVar4)) {
          in_stack_ffffffffffffff40 = (HTimer *)(*pvVar4 / *(double *)(lVar7 + 0x38));
          HVector::saxpy(in_stack_ffffffffffffffa0,
                         (double)CONCAT44(in_stack_ffffffffffffff9c,iVar10),pivot_00);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(piVar3 + 8),(long)iVar11);
          *pvVar4 = (value_type)in_stack_ffffffffffffff40;
        }
      }
    }
  }
  HTimer::recordFinish(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  return;
}

Assistant:

void HDual::major_updateFtranFinal() {
    model->timer.recordStart(HTICK_FTRAN_MIX);
    int updateFTRAN_inDense = dualRHS.workCount < 0;
    if (updateFTRAN_inDense) {
        for (int iFn = 0; iFn < multi_nFinish; iFn++) {
            multi_finish[iFn].column->count = -1;
            multi_finish[iFn].row_ep->count = -1;
            double *myCol = &multi_finish[iFn].column->array[0];
            double *myRow = &multi_finish[iFn].row_ep->array[0];
            for (int jFn = 0; jFn < iFn; jFn++) {
                int pivotRow = multi_finish[jFn].rowOut;
                const double pivotAlpha = multi_finish[jFn].alphaRow;
                const double *pivotArray = &multi_finish[jFn].column->array[0];
                double pivotX1 = myCol[pivotRow];
                double pivotX2 = myRow[pivotRow];

                // The FTRAN regular buffer
                if (fabs(pivotX1) > HSOL_CONST_TINY) {
                    const double pivot = pivotX1 / pivotAlpha;
#pragma omp parallel for
                    for (int i = 0; i < numRow; i++)
                        myCol[i] -= pivot * pivotArray[i];
                    myCol[pivotRow] = pivot;
                }
                // The FTRAN-DSE buffer
                if (fabs(pivotX2) > HSOL_CONST_TINY) {
                    const double pivot = pivotX2 / pivotAlpha;
#pragma omp parallel for
                    for (int i = 0; i < numRow; i++)
                        myRow[i] -= pivot * pivotArray[i];
                    myRow[pivotRow] = pivot;
                }
            }
        }
    } else {
        for (int iFn = 0; iFn < multi_nFinish; iFn++) {
            MFinish *Fin = &multi_finish[iFn];
            HVector *Col = Fin->column;
            HVector *Row = Fin->row_ep;
            for (int jFn = 0; jFn < iFn; jFn++) {
                MFinish *jFinish = &multi_finish[jFn];
                int pivotRow = jFinish->rowOut;
                double pivotX1 = Col->array[pivotRow];
                // The FTRAN regular buffer
                if (fabs(pivotX1) > HSOL_CONST_TINY) {
                    pivotX1 /= jFinish->alphaRow;
                    Col->saxpy(-pivotX1, jFinish->column);
                    Col->array[pivotRow] = pivotX1;
                }
                // The FTRAN-DSE buffer
                double pivotX2 = Row->array[pivotRow];
                if (fabs(pivotX2) > HSOL_CONST_TINY) {
                    pivotX2 /= jFinish->alphaRow;
                    Row->saxpy(-pivotX2, jFinish->column);
                    Row->array[pivotRow] = pivotX2;
                }
            }
        }
    }
    model->timer.recordFinish(HTICK_FTRAN_MIX);
}